

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cute_reporter_tests.c
# Opt level: O2

int mocked_vprintf(char *format,__va_list_tag *arguments)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  char buffer [10000];
  
  __vsnprintf_chk(buffer,10000,1,10000,format,arguments);
  pcVar3 = output;
  sVar1 = strlen(output);
  sVar2 = strlen(buffer);
  pcVar3 = (char *)realloc(pcVar3,sVar1 + sVar2 + 1);
  strcat(pcVar3,buffer);
  output = pcVar3;
  sVar1 = strlen(pcVar3);
  return (int)sVar1;
}

Assistant:

static int mocked_vprintf(const char *format, va_list arguments) {
    char buffer[10000];

    vsnprintf(buffer, sizeof(buffer), format, arguments);

    output = concat(output, buffer);
    return strlen(output);
}